

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceStub
          (Generator *this,ServiceDescriptor *descriptor)

{
  Printer *pPVar1;
  string *value;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ServiceDescriptor *local_18;
  ServiceDescriptor *descriptor_local;
  Generator *this_local;
  
  pPVar1 = this->printer_;
  local_18 = descriptor;
  descriptor_local = (ServiceDescriptor *)this;
  value = ServiceDescriptor::name_abi_cxx11_(descriptor);
  io::Printer::Print(pPVar1,"class $class_name$_Stub($class_name$):\n","class_name",value);
  io::Printer::Indent(this->printer_);
  pPVar1 = this->printer_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DESCRIPTOR",&local_39);
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_70,this,local_18);
  io::Printer::Print(pPVar1,
                     "__metaclass__ = service_reflection.GeneratedServiceStubType\n$descriptor_key$ = $descriptor_name$\n"
                     ,"descriptor_key",&local_38,"descriptor_name",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  io::Printer::Outdent(this->printer_);
  return;
}

Assistant:

void Generator::PrintServiceStub(const ServiceDescriptor& descriptor) const {
  // Print the service stub.
  printer_->Print("class $class_name$_Stub($class_name$):\n",
                  "class_name", descriptor.name());
  printer_->Indent();
  printer_->Print(
      "__metaclass__ = service_reflection.GeneratedServiceStubType\n"
      "$descriptor_key$ = $descriptor_name$\n",
      "descriptor_key", kDescriptorKey,
      "descriptor_name", ModuleLevelServiceDescriptorName(descriptor));
  printer_->Outdent();
}